

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O2

cx_string<12UL> mserialize::cx_strcat<12ul>(cx_string<12UL> *strings)

{
  char *pcVar1;
  bool bVar2;
  size_t s;
  long lVar3;
  cx_string<12UL> cVar4;
  char buffer [13];
  char local_28 [16];
  undefined1 local_18 [16];
  
  pcVar1 = local_28;
  local_28[8] = '\0';
  local_28[9] = '\0';
  local_28[10] = '\0';
  local_28[0xb] = '\0';
  local_28[0xc] = '\0';
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  bVar2 = true;
  while (bVar2) {
    for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 1) {
      pcVar1[lVar3] = strings->_data[lVar3];
    }
    pcVar1 = pcVar1 + 0xc;
    bVar2 = false;
  }
  cx_string<12UL>::cx_string((cx_string<12UL> *)local_18,local_28);
  cVar4._data._8_5_ = (uint5)(uint)local_18._12_4_ << 0x20 | (uint5)(uint)local_18._8_4_;
  cVar4._data[0] = local_18[0];
  cVar4._data[1] = local_18[1];
  cVar4._data[2] = local_18[2];
  cVar4._data[3] = local_18[3];
  cVar4._data[4] = local_18[4];
  cVar4._data[5] = local_18[5];
  cVar4._data[6] = local_18[6];
  cVar4._data[7] = local_18[7];
  return (cx_string<12UL>)cVar4._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}